

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void luaK_setreturns(FuncState *fs,expdesc *e,int nresults)

{
  int iVar1;
  Instruction *pIVar2;
  uint uVar3;
  
  pIVar2 = fs->f->code;
  iVar1 = (e->u).info;
  luaY_checklimit(fs,nresults + 1,0xff,"multiple results");
  uVar3 = (nresults + 1) * 0x1000000;
  if (e->k == VCALL) {
    pIVar2[iVar1] = uVar3 | pIVar2[iVar1] & 0xffffff;
  }
  else {
    pIVar2[iVar1] = (uint)fs->freereg << 7 | uVar3 | pIVar2[iVar1] & 0xff807f;
    luaK_checkstack(fs,1);
    fs->freereg = fs->freereg + '\x01';
  }
  return;
}

Assistant:

void luaK_setreturns (FuncState *fs, expdesc *e, int nresults) {
  Instruction *pc = &getinstruction(fs, e);
  luaY_checklimit(fs, nresults + 1, MAXARG_C, "multiple results");
  if (e->k == VCALL)  /* expression is an open function call? */
    SETARG_C(*pc, nresults + 1);
  else {
    lua_assert(e->k == VVARARG);
    SETARG_C(*pc, nresults + 1);
    SETARG_A(*pc, fs->freereg);
    luaK_reserveregs(fs, 1);
  }
}